

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_line_section.hpp
# Opt level: O2

container<pstore::repo::internal_fixup> __thiscall
pstore::repo::debug_line_dispatcher::ifixups(debug_line_dispatcher *this)

{
  container<pstore::repo::internal_fixup> cVar1;
  
  cVar1 = generic_section::ifixups(&this->d_->g_);
  return cVar1;
}

Assistant:

container<internal_fixup> ifixups () const final { return d_.ifixups (); }